

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_matrix.h
# Opt level: O0

_matrix<double> * __thiscall
xray_re::_matrix<double>::mk_xform(_matrix<double> *this,_quaternion<double> *q,_vector3<double> *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double s;
  double zz;
  double yz;
  double yy;
  double xz;
  double xy;
  double xx;
  double wz;
  double wy;
  double wx;
  _vector3<double> *v_local;
  _quaternion<double> *q_local;
  _matrix<double> *this_local;
  
  dVar1 = (q->field_0).field_0.w * (q->field_0).field_0.x;
  dVar2 = (q->field_0).field_0.w * (q->field_0).field_0.y;
  dVar3 = (q->field_0).field_0.w * (q->field_0).field_0.z;
  dVar4 = (q->field_0).field_0.x * (q->field_0).field_0.x;
  dVar5 = (q->field_0).field_0.x * (q->field_0).field_0.y;
  dVar6 = (q->field_0).field_0.x * (q->field_0).field_0.z;
  dVar7 = (q->field_0).field_0.y * (q->field_0).field_0.y;
  dVar8 = (q->field_0).field_0.y * (q->field_0).field_0.z;
  dVar9 = (q->field_0).field_0.z * (q->field_0).field_0.z;
  dVar10 = 2.0 / ((q->field_0).field_0.w * (q->field_0).field_0.w + dVar4 + dVar7 + dVar9);
  _vector3<double>::set
            ((_vector3<double> *)this,-dVar10 * (dVar7 + dVar9) + 1.0,dVar10 * (dVar5 - dVar3),
             dVar10 * (dVar6 + dVar2));
  (this->field_0).field_0._14 = 0.0;
  _vector3<double>::set
            (&(this->field_0).field_1.j,dVar10 * (dVar5 + dVar3),-dVar10 * (dVar4 + dVar9) + 1.0,
             dVar10 * (dVar8 - dVar1));
  (this->field_0).field_0._24 = 0.0;
  _vector3<double>::set
            (&(this->field_0).field_1.k,dVar10 * (dVar6 - dVar2),dVar10 * (dVar8 + dVar1),
             -dVar10 * (dVar4 + dVar7) + 1.0);
  (this->field_0).field_0._34 = 0.0;
  _vector3<double>::set<double>(&(this->field_0).field_1.c,v);
  (this->field_0).field_0._44 = 1.0;
  return this;
}

Assistant:

_matrix<T>& _matrix<T>::mk_xform(const _quaternion<T>& q, const _vector3<T>& v)
{
	T wx = q.w*q.x;
	T wy = q.w*q.y;
	T wz = q.w*q.z;

	T xx = q.x*q.x;
	T xy = q.x*q.y;
	T xz = q.x*q.z;

	T yy = q.y*q.y;
	T yz = q.y*q.z;
	T zz = q.z*q.z;

#if 1
	// can't assume the unit quaternion because of quantization errors.
	T s = T(2)/(xx + yy + zz + q.w*q.w);
#else
	xr_assert(equivalent<T>(q.magnitude(), 1, T(1e-3)));
	const T s = 2;
#endif

	i.set(T(1) - s*(yy + zz), s*(xy - wz), s*(xz + wy)); _14 = 0;
	j.set(s*(xy + wz), T(1) - s*(xx + zz), s*(yz - wx)); _24 = 0;
	k.set(s*(xz - wy), s*(yz + wx), T(1) - s*(xx + yy)); _34 = 0;
	c.set(v); _44 = T(1);

	return *this;
}